

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O3

void __thiscall CommandLineParser::fail(CommandLineParser *this,string *message)

{
  runtime_error *this_00;
  long *plVar1;
  long *plVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_88,"while parsing option ",&this->m_option);
  plVar1 = (long *)std::__cxx11::string::append((char *)&bStack_88);
  local_68 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_68 == plVar2) {
    local_58 = *plVar2;
    lStack_50 = plVar1[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar2;
  }
  local_60 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_68,(ulong)(message->_M_dataplus)._M_p);
  local_48 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_48 == plVar2) {
    local_38 = *plVar2;
    lStack_30 = plVar1[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar2;
  }
  local_40 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_48);
  *(undefined ***)this_00 = &PTR__runtime_error_0010ad60;
  __cxa_throw(this_00,&CommandLineParserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void 
CommandLineParser::fail( std::string message )
{
  throw CommandLineParserException( "while parsing option " + m_option+
            ",\n" + message );
}